

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::recalculate_unchoke_slots(session_impl *this)

{
  _Atomic_word *p_Var1;
  byte *pbVar2;
  mutex *pmVar3;
  _Rb_tree_header *p_Var4;
  uint uVar5;
  peer_connection *ppVar6;
  _Base_ptr this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _func_int *p_Var8;
  uint uVar9;
  mutex_type *pmVar10;
  counters *pcVar11;
  _Atomic_word _Var12;
  int iVar13;
  uint uVar14;
  int iVar15;
  time_point tVar16;
  _Base_ptr p_Var17;
  undefined4 extraout_var;
  int64_t iVar18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined1 auVar19 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  element_type *peVar21;
  long lVar22;
  bool bVar23;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  peers;
  undefined1 local_78 [8];
  mutex_type *pmStack_70;
  pointer local_68;
  counters *local_58;
  unique_lock<std::mutex> local_50;
  counters *local_40;
  time_duration local_38;
  
  tVar16 = time_now();
  lVar22 = (long)tVar16.__d.__r - (this->m_last_choke).__d.__r;
  (this->m_last_choke).__d.__r = (rep)tVar16.__d.__r;
  pmVar3 = &(this->m_settings).m_mutex;
  pmStack_70 = (mutex_type *)((ulong)pmStack_70 & 0xffffffffffffff00);
  local_78 = (undefined1  [8])pmVar3;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_78);
  pmStack_70._0_1_ = true;
  iVar13 = (this->m_settings).m_store.m_ints._M_elems[0x1f];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
  if (iVar13 == 0) {
    pmStack_70._0_1_ = false;
    local_78 = (undefined1  [8])pmVar3;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_78);
    pmStack_70 = (mutex_type *)CONCAT71(pmStack_70._1_7_,true);
    iVar13 = (this->m_settings).m_store.m_ints._M_elems[0x53];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
    if (iVar13 < 0) {
      counters::set_value(&this->m_stats_counters,0xfd,0x7fffffff);
      return;
    }
  }
  local_78 = (undefined1  [8])0x0;
  pmStack_70 = (mutex_type *)0x0;
  local_68 = (pointer)0x0;
  p_Var17 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  local_58 = (counters *)pmVar3;
  local_38.__r = lVar22;
  if ((_Rb_tree_header *)p_Var17 != p_Var4) {
    local_40 = &this->m_stats_counters;
    do {
      ppVar6 = *(peer_connection **)(p_Var17 + 1);
      this_00 = p_Var17[1]._M_parent;
      if (this_00 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
      }
      p_Var17 = (_Base_ptr)::std::_Rb_tree_increment(p_Var17);
      peVar21 = (ppVar6->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (ppVar6->super_peer_connection_hot_members).m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      p_Var20 = p_Var7;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_weak_count = p_Var7->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_weak_count = p_Var7->_M_weak_count + 1;
        }
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          _Var12 = p_Var7->_M_use_count;
          do {
            if (_Var12 == 0) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar13 = p_Var7->_M_use_count;
            bVar23 = _Var12 == iVar13;
            if (bVar23) {
              p_Var7->_M_use_count = _Var12 + 1;
              iVar13 = _Var12;
            }
            _Var12 = iVar13;
            UNLOCK();
          } while (!bVar23);
        }
      }
      if (p_Var20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        peVar21 = (torrent *)0x0;
      }
      else if (p_Var20->_M_use_count == 0) {
        peVar21 = (torrent *)0x0;
      }
      if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &p_Var7->_M_weak_count;
          _Var12 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          _Var12 = p_Var7->_M_weak_count;
          p_Var7->_M_weak_count = _Var12 + -1;
        }
        if (_Var12 == 1) {
          (*p_Var7->_vptr__Sp_counted_base[3])(p_Var7);
        }
      }
      iVar13 = (*(ppVar6->super_bandwidth_socket)._vptr_bandwidth_socket[7])(ppVar6);
      lVar22 = CONCAT44(extraout_var,iVar13);
      bVar23 = peer_connection::ignore_unchoke_slots(ppVar6);
      if ((((lVar22 == 0) || (peVar21 == (torrent *)0x0 || bVar23)) || (*(int *)(lVar22 + 0x1b) < 0)
          ) || (bVar23 = torrent::is_paused(peVar21), bVar23)) {
LAB_002c3f35:
        peer_connection::reset_choke_counters(ppVar6);
      }
      else {
        if ((((ppVar6->field_0x887 & 2) == 0) ||
            (iVar13 = (*(ppVar6->super_bandwidth_socket)._vptr_bandwidth_socket[1])(ppVar6),
            (char)iVar13 != '\0')) ||
           (((ppVar6->super_peer_connection_hot_members).field_0x28 & 2) != 0)) {
          iVar13 = (*(ppVar6->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])(ppVar6);
          if ((char)iVar13 == '\0') {
            if ((*(byte *)(lVar22 + 0x1b) & 0x40) != 0) {
              counters::inc_stats_counter(local_40,0xea,-1);
              *(byte *)(lVar22 + 0x1b) = *(byte *)(lVar22 + 0x1b) & 0xbf;
              this->m_optimistic_unchoke_time_scaler = 0;
            }
            torrent::choke_peer(peVar21,ppVar6);
          }
          goto LAB_002c3f35;
        }
        local_50._M_device = (mutex_type *)ppVar6;
        ::std::
        vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
        ::emplace_back<libtorrent::aux::peer_connection*>
                  ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                    *)local_78,(peer_connection **)&local_50);
      }
      if (this_00 != (_Base_ptr)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
    } while ((_Rb_tree_header *)p_Var17 != p_Var4);
  }
  uVar14 = unchoke_sort((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         *)local_78,local_38,&this->m_settings);
  pcVar11 = local_58;
  local_50._M_device = (mutex_type *)local_58;
  local_50._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_50);
  local_50._M_owns = true;
  iVar13 = (this->m_settings).m_store.m_ints._M_elems[0x1f];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_50);
  if (iVar13 == 0) {
    local_50._M_device = (mutex_type *)pcVar11;
    local_50._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_50);
    local_50._M_owns = true;
    uVar5 = (this->m_settings).m_store.m_ints._M_elems[0x53];
    ::std::unique_lock<std::mutex>::~unique_lock(&local_50);
    uVar9 = 0x7fffffff;
    if (uVar5 < 0x7fffffff) {
      uVar9 = uVar5;
    }
    counters::set_value(&this->m_stats_counters,0xfd,(ulong)uVar9);
  }
  else {
    counters::set_value(&this->m_stats_counters,0xfd,(long)(int)uVar14);
  }
  if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
    session_log(this,"RECALCULATE UNCHOKE SLOTS: [ peers: %d eligible-peers: %d allowed-slots: %d ]"
                ,(ulong)(uint)(this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count
                ,(ulong)((long)pmStack_70 - (long)local_78) >> 3,(ulong)uVar14);
  }
  local_58 = &this->m_stats_counters;
  iVar18 = counters::operator[](local_58,0xea);
  pmVar10 = pmStack_70;
  iVar13 = (int)iVar18;
  if ((int)iVar18 == 0) {
    iVar13 = 1;
    if (1 < (int)uVar14 / 5) {
      iVar13 = (int)uVar14 / 5;
    }
  }
  if (local_78 != (undefined1  [8])pmStack_70) {
    iVar13 = uVar14 - iVar13;
    auVar19 = local_78;
    do {
      ppVar6 = (peer_connection *)(((mutex_type *)auVar19)->super___mutex_base)._M_mutex.__align;
      peer_connection::reset_choke_counters(ppVar6);
      peVar21 = (ppVar6->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (ppVar6->super_peer_connection_hot_members).m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      p_Var20 = p_Var7;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_weak_count = p_Var7->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_weak_count = p_Var7->_M_weak_count + 1;
        }
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          _Var12 = p_Var7->_M_use_count;
          do {
            if (_Var12 == 0) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar15 = p_Var7->_M_use_count;
            bVar23 = _Var12 == iVar15;
            if (bVar23) {
              p_Var7->_M_use_count = _Var12 + 1;
              iVar15 = _Var12;
            }
            _Var12 = iVar15;
            UNLOCK();
          } while (!bVar23);
        }
      }
      if (p_Var20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        peVar21 = (torrent *)0x0;
      }
      else if (p_Var20->_M_use_count == 0) {
        peVar21 = (torrent *)0x0;
      }
      if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &p_Var7->_M_weak_count;
          _Var12 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          _Var12 = p_Var7->_M_weak_count;
          p_Var7->_M_weak_count = _Var12 + -1;
        }
        if (_Var12 == 1) {
          (*p_Var7->_vptr__Sp_counted_base[3])(p_Var7);
        }
      }
      p_Var8 = (ppVar6->super_bandwidth_socket)._vptr_bandwidth_socket[0xc];
      if (iVar13 < 1) {
        iVar15 = (*p_Var8)(ppVar6);
        if (((char)iVar15 == '\0') &&
           (iVar15 = (*(ppVar6->super_bandwidth_socket)._vptr_bandwidth_socket[7])(ppVar6),
           (*(byte *)(CONCAT44(extraout_var_02,iVar15) + 0x1b) & 0x40) == 0)) {
          torrent::choke_peer(peVar21,ppVar6);
        }
      }
      else {
        iVar15 = (*p_Var8)(ppVar6);
        if (((char)iVar15 == '\0') || (bVar23 = torrent::unchoke_peer(peVar21,ppVar6,false), bVar23)
           ) {
          iVar15 = (*(ppVar6->super_bandwidth_socket)._vptr_bandwidth_socket[7])(ppVar6);
          iVar13 = iVar13 + -1;
          if ((*(byte *)(CONCAT44(extraout_var_00,iVar15) + 0x1b) & 0x40) != 0) {
            this->m_optimistic_unchoke_time_scaler = 0;
            iVar15 = (*(ppVar6->super_bandwidth_socket)._vptr_bandwidth_socket[7])(ppVar6);
            pbVar2 = (byte *)(CONCAT44(extraout_var_01,iVar15) + 0x1b);
            *pbVar2 = *pbVar2 & 0xbf;
            counters::inc_stats_counter(local_58,0xea,-1);
          }
        }
      }
      auVar19 = (undefined1  [8])((long)&(((mutex_type *)auVar19)->super___mutex_base)._M_mutex + 8)
      ;
    } while (auVar19 != (undefined1  [8])pmVar10);
  }
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

void session_impl::recalculate_unchoke_slots()
	{
		TORRENT_ASSERT(is_single_thread());

		time_point const now = aux::time_now();
		time_duration const unchoke_interval = now - m_last_choke;
		m_last_choke = now;

		// if we unchoke everyone, skip this logic
		if (settings().get_int(settings_pack::choking_algorithm) == settings_pack::fixed_slots_choker
			&& settings().get_int(settings_pack::unchoke_slots_limit) < 0)
		{
			m_stats_counters.set_value(counters::num_unchoke_slots, std::numeric_limits<int>::max());
			return;
		}

		// build list of all peers that are
		// unchokable.
		// TODO: 3 there should be a pre-calculated list of all peers eligible for
		// unchoking
		std::vector<peer_connection*> peers;
		for (auto i = m_connections.begin(); i != m_connections.end();)
		{
			std::shared_ptr<peer_connection> p = *i;
			TORRENT_ASSERT(p);
			++i;
			torrent* const t = p->associated_torrent().lock().get();
			torrent_peer* const pi = p->peer_info_struct();

			if (p->ignore_unchoke_slots() || t == nullptr || pi == nullptr
				|| pi->web_seed || t->is_paused())
			{
				p->reset_choke_counters();
				continue;
			}

			if (!p->is_peer_interested()
				|| p->is_disconnecting()
				|| p->is_connecting())
			{
				// this peer is not unchokable. So, if it's unchoked
				// already, make sure to choke it.
				if (p->is_choked())
				{
					p->reset_choke_counters();
					continue;
				}
				if (pi && pi->optimistically_unchoked)
				{
					m_stats_counters.inc_stats_counter(counters::num_peers_up_unchoked_optimistic, -1);
					pi->optimistically_unchoked = false;
					// force a new optimistic unchoke
					m_optimistic_unchoke_time_scaler = 0;
					// TODO: post a message to have this happen
					// immediately instead of waiting for the next tick
				}
				t->choke_peer(*p);
				p->reset_choke_counters();
				continue;
			}

			peers.push_back(p.get());
		}

		int const allowed_upload_slots = unchoke_sort(peers
			, unchoke_interval, m_settings);

		if (m_settings.get_int(settings_pack::choking_algorithm) == settings_pack::fixed_slots_choker)
		{
			int const upload_slots = get_int_setting(settings_pack::unchoke_slots_limit);
			m_stats_counters.set_value(counters::num_unchoke_slots, upload_slots);
		}
		else
		{
			m_stats_counters.set_value(counters::num_unchoke_slots
				, allowed_upload_slots);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("RECALCULATE UNCHOKE SLOTS: [ peers: %d "
				"eligible-peers: %d"
				" allowed-slots: %d ]"
				, int(m_connections.size())
				, int(peers.size())
				, allowed_upload_slots);
		}
#endif

		int const unchoked_counter_optimistic
			= int(m_stats_counters[counters::num_peers_up_unchoked_optimistic]);
		int const num_opt_unchoke = (unchoked_counter_optimistic == 0)
			? std::max(1, allowed_upload_slots / 5) : unchoked_counter_optimistic;

		int unchoke_set_size = allowed_upload_slots - num_opt_unchoke;

		// go through all the peers and unchoke the first ones and choke
		// all the other ones.
		for (auto* const p : peers)
		{
			TORRENT_ASSERT(p != nullptr);
			TORRENT_ASSERT(!p->ignore_unchoke_slots());

			// this will update the m_uploaded_at_last_unchoke
			p->reset_choke_counters();

			torrent* t = p->associated_torrent().lock().get();
			TORRENT_ASSERT(t);

			if (unchoke_set_size > 0)
			{
				// yes, this peer should be unchoked
				if (p->is_choked())
				{
					if (!t->unchoke_peer(*p))
						continue;
				}

				--unchoke_set_size;

				TORRENT_ASSERT(p->peer_info_struct());
				if (p->peer_info_struct()->optimistically_unchoked)
				{
					// force a new optimistic unchoke
					// since this one just got promoted into the
					// proper unchoke set
					m_optimistic_unchoke_time_scaler = 0;
					p->peer_info_struct()->optimistically_unchoked = false;
					m_stats_counters.inc_stats_counter(counters::num_peers_up_unchoked_optimistic, -1);
				}
			}
			else
			{
				// no, this peer should be choked
				TORRENT_ASSERT(p->peer_info_struct());
				if (!p->is_choked() && !p->peer_info_struct()->optimistically_unchoked)
					t->choke_peer(*p);
			}
		}
	}